

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  Graph *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  _Rb_tree_header *p_Var8;
  ulong uVar9;
  pointer pcVar10;
  ulong uVar11;
  pointer piVar12;
  int head;
  cmComputeComponentGraph *local_c8;
  cmComputeTargetDepends *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  
  this_00 = &this->FinalGraph;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->InitialGraph).
                   super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                   super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18);
  local_b8 = &ccg->TarjanComponents;
  this_01 = &this->ComponentHead;
  std::vector<int,_std::allocator<int>_>::resize
            (this_01,((long)(ccg->Components).
                            super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(ccg->Components).
                           super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x18);
  local_c0 = this;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ComponentTail,
             ((long)(ccg->Components).
                    super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(ccg->Components).
                   super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x18);
  uVar7 = ((long)(ccg->Components).
                 super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(ccg->Components).
                super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  uVar9 = 0;
  iVar6 = (int)uVar7;
  uVar11 = 0;
  if (0 < iVar6) {
    uVar11 = uVar7 & 0xffffffff;
  }
  p_Var1 = &visited._M_t._M_impl.super__Rb_tree_header;
  local_c8 = ccg;
  do {
    p_Var8 = &emitted._M_t._M_impl.super__Rb_tree_header;
    if (uVar9 == uVar11) {
      uVar7 = ((long)(local_c8->ComponentGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(local_c8->ComponentGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18;
      uVar11 = 0;
      local_b8 = (vector<int,_std::allocator<int>_> *)(uVar7 & 0xffffffff);
      if ((int)uVar7 < 1) {
        local_b8 = (vector<int,_std::allocator<int>_> *)uVar11;
      }
      while ((vector<int,_std::allocator<int>_> *)uVar11 != local_b8) {
        iVar2 = (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11];
        pcVar4 = (local_c8->ComponentGraph).
                 super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                 super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_c0 = (cmComputeTargetDepends *)uVar11;
        for (pcVar10 = *(pointer *)
                        &pcVar4[uVar11].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                         super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
            pcVar10 !=
            *(pointer *)
             ((long)&pcVar4[uVar11].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                     super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
            pcVar10 = pcVar10 + 1) {
          emitted._M_t._M_impl._0_4_ =
               (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[pcVar10->Dest];
          emitted._M_t._M_impl._4_1_ = pcVar10->Strong;
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::emplace_back<cmGraphEdge>
                    (&(this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2].
                      super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,
                     (cmGraphEdge *)&emitted);
        }
        uVar11 = (long)local_c0 + 1;
      }
LAB_00416a20:
      return (long)iVar6 <= (long)uVar9;
    }
    head = -1;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pcVar3 = (local_c8->Components).
             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar12 = *(pointer *)
               ((long)&pcVar3[uVar9].super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
    for (; piVar12 !=
           *(pointer *)
            &pcVar3[uVar9].super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl; piVar12 = piVar12 + -1) {
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      visited._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      visited._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      bVar5 = IntraComponent(local_c0,local_b8,(int)uVar9,piVar12[-1],&head,&emitted,
                             (set<int,_std::less<int>,_std::allocator<int>_> *)&visited._M_t);
      if (!bVar5) {
        ComplainAboutBadComponent(local_c0,local_c8,(int)uVar9,true);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&visited._M_t);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&emitted._M_t);
        goto LAB_00416a20;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&visited._M_t);
    }
    (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar9] = head;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&emitted._M_t);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<int> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    int head = -1;
    std::set<int> emitted;
    NodeList const& nl = components[c];
    for (NodeList::const_reverse_iterator ni = nl.rbegin(); ni != nl.rend();
         ++ni) {
      std::set<int> visited;
      if (!this->IntraComponent(cmap, c, *ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  int n = static_cast<int>(cgraph.size());
  for (int depender_component = 0; depender_component < n;
       ++depender_component) {
    int depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int dependee_component = *ni;
      int dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].push_back(
        cmGraphEdge(dependee_component_head, ni->IsStrong()));
    }
  }
  return true;
}